

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cc
# Opt level: O3

void __thiscall
tchecker::tck_simulate::hr_display_t::hr_display_t
          (hr_display_t *this,ostream *os,shared_ptr<tchecker::zg::zg_t> *zg)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  invalid_argument *this_00;
  
  (this->super_display_t)._vptr_display_t = (_func_int **)&PTR__hr_display_t_00215240;
  this->_os = os;
  peVar2 = (zg->super___shared_ptr<tchecker::zg::zg_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->_zg).super___shared_ptr<tchecker::zg::zg_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  p_Var1 = (zg->super___shared_ptr<tchecker::zg::zg_t,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (this->_zg).super___shared_ptr<tchecker::zg::zg_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
      peVar2 = (this->_zg).super___shared_ptr<tchecker::zg::zg_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  if (peVar2 != (element_type *)0x0) {
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Invalid nullptr zone graph");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

hr_display_t::hr_display_t(std::ostream & os, std::shared_ptr<tchecker::zg::zg_t> const & zg) : _os(os), _zg(zg)
{
  if (_zg.get() == nullptr)
    throw std::invalid_argument("Invalid nullptr zone graph");
}